

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall MxxColl_ScattervUnknownSize_Test::TestBody(MxxColl_ScattervUnknownSize_Test *this)

{
  int iVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int i;
  long lVar5;
  int iVar6;
  bool bVar7;
  AssertHelper local_f8;
  AssertionResult gtest_ar;
  _Vector_base<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  comm c;
  vector<int,_std::allocator<int>_> vec;
  
  mxx::comm::comm(&c);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = c.m_size + -1;
  if (c.m_rank == iVar1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&sizes,(long)c.m_size);
    iVar1 = 0;
    iVar3 = 0;
    for (lVar5 = 0; lVar5 < c.m_size; lVar5 = lVar5 + 1) {
      sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] = (long)((c.m_size - (int)lVar5) * 5 + -3);
      lVar2 = (long)((c.m_size + iVar3) * 5 + -3);
      iVar6 = iVar1;
      while (bVar7 = lVar2 != 0, lVar2 = lVar2 + -1, bVar7) {
        gtest_ar._0_4_ = iVar6;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&vec,(int *)&gtest_ar);
        iVar6 = iVar6 + -0x924;
      }
      iVar3 = iVar3 + -1;
      iVar1 = iVar1 + 0x1bc;
    }
    iVar1 = c.m_size + -1;
  }
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (c.m_rank == iVar1) {
    mxx::scatterv<int>((vector<int,_std::allocator<int>_> *)&gtest_ar,&vec,&sizes,c.m_rank,&c);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&result,&gtest_ar);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&gtest_ar);
  }
  else {
    mxx::comm::comm((comm *)&gtest_ar);
    mxx::scatterv_recv<int>((vector<int,_std::allocator<int>_> *)&local_d0,iVar1,(comm *)&gtest_ar);
    std::vector<int,_std::allocator<int>_>::_M_move_assign(&result,&local_d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d0);
    mxx::comm::~comm((comm *)&gtest_ar);
  }
  local_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = (c.m_size - c.m_rank) * 5 + -3;
  local_f8.data_._0_4_ =
       (undefined4)
       ((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"5*(c.size()-c.rank())-3","(int)result.size()",(int *)&local_d0,
             (int *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0xe6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d0);
LAB_0014cb18:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar5 = 0;
    iVar1 = 0;
    for (lVar2 = 0;
        lVar2 < (int)((ulong)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2); lVar2 = lVar2 + 1) {
      local_d0._M_impl.super__Vector_impl_data._M_start._0_4_ = c.m_rank * 0x1bc + iVar1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"-2340*j+444*c.rank()","result[j]",(int *)&local_d0,
                 (int *)((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar5));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_d0);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0xe8,pcVar4);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d0);
        goto LAB_0014cb18;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      iVar1 = iVar1 + -0x924;
      lVar5 = lVar5 + 4;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&result.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vec.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxColl, ScattervUnknownSize) {
    mxx::comm c;
    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from last process
    if (c.rank() == c.size()-1) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            size_t size = 5*(c.size()-i)-3;
            sizes[i] = size;
            for (size_t j = 0; j < size; ++j) {
                vec.push_back(-2340*(int)j + 444*i);
            }
        }
    }

    std::vector<int> result;
    if (c.rank() == c.size()-1) {
        result = mxx::scatterv(vec, sizes, c.size()-1, c);
    } else {
        result = mxx::scatterv_recv<int>(c.size()-1);
    }

    ASSERT_EQ(5*(c.size()-c.rank())-3, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(-2340*j+444*c.rank(), result[j]);
    }
}